

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void __thiscall kratos::Var::clear_sinks(Var *this,bool remove_parent)

{
  long lVar1;
  _Hash_node_base *p_Var2;
  
  p_Var2 = (this->sinks_)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0 && remove_parent) {
    do {
      lVar1 = (*(code *)(p_Var2[1]._M_nxt)->_M_nxt[4]._M_nxt)();
      if (lVar1 != 0) {
        (*(code *)(p_Var2[1]._M_nxt)->_M_nxt[9]._M_nxt)();
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->sinks_)._M_h);
  return;
}

Assistant:

void Var::clear_sinks(bool remove_parent) {  // NOLINT
    if (remove_parent) {
        for (auto const &stmt : sinks_) {
            if (stmt->parent()) stmt->remove_from_parent();
        }
    }

    sinks_.clear();
}